

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int bernoulli_cdf_inv(double cdf,double a)

{
  uint local_1c;
  int x;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    local_1c = (uint)(1.0 - a < cdf);
    return local_1c;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"BERNOULLI_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

int bernoulli_cdf_inv ( double cdf, double a )

//****************************************************************************80
//
//  Purpose:
//
//    BERNOULLI_CDF_INV inverts the Bernoulli CDF.
//
//  Modified:
//
//    22 May 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//    0.0 <= CDF <= 1.0.
//
//    Input, double A, the parameter of the PDF.
//    0.0 <= A <= 1.0.
//
//    Output, int BERNOULLI_CDF_INV, the corresponding argument.
//
{
  int x;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << "\n";
    cerr << "BERNOULLI_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf <= 1.0 - a )
  {
    x = 0;
  }
  else
  {
    x = 1;
  }

  return x;
}